

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_disconnect(connectdata *conn,_Bool dead_connection)

{
  anon_union_264_9_0449b319_for_proto *pp;
  connectdata *pcVar1;
  char *pcVar2;
  CURLcode CVar3;
  undefined7 in_register_00000031;
  pop3_conn *pop3c;
  
  pp = &conn->proto;
  if ((((int)CONCAT71(in_register_00000031,dead_connection) == 0) &&
      (pcVar1 = (conn->proto).ftpc.pp.conn, pcVar1 != (connectdata *)0x0)) &&
     ((pcVar1->bits).protoconnstart == true)) {
    CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","QUIT");
    if (CVar3 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_FETCH_FINAL;
      do {
        CVar3 = Curl_pp_statemach(&(pp->ftpc).pp,true);
        if ((conn->proto).imapc.state == IMAP_STOP) break;
      } while (CVar3 == CURLE_OK);
    }
  }
  Curl_pp_disconnect(&(pp->ftpc).pp);
  Curl_sasl_cleanup(conn,(conn->proto).pop3c.authused);
  pcVar2 = (conn->proto).imapc.mailbox_uidvalidity;
  if (pcVar2 != (char *)0x0) {
    (*Curl_cfree)(pcVar2);
    (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode pop3_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  /* The POP3 session may or may not have been allocated/setup at this
     point! */
  if(!dead_connection && pop3c->pp.conn && pop3c->pp.conn->bits.protoconnstart)
    if(!pop3_perform_quit(conn))
      (void)pop3_block_statemach(conn); /* ignore errors on QUIT */

  /* Disconnect from the server */
  Curl_pp_disconnect(&pop3c->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, pop3c->authused);

  /* Cleanup our connection based variables */
  Curl_safefree(pop3c->apoptimestamp);

  return CURLE_OK;
}